

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

void __thiscall ami_nvar_t::nvar_entry_t::~nvar_entry_t(nvar_entry_t *this)

{
  nvar_entry_t *this_local;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__nvar_entry_t_0026f958;
  _clean_up(this);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
            (&this->m__io__raw_body);
  std::__cxx11::string::~string((string *)&this->m__raw_body);
  std::__cxx11::string::~string((string *)&this->m_invoke_end_offset);
  std::
  unique_ptr<ami_nvar_t::nvar_entry_body_t,_std::default_delete<ami_nvar_t::nvar_entry_body_t>_>::
  ~unique_ptr(&this->m_body);
  std::
  unique_ptr<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>::
  ~unique_ptr(&this->m_attributes);
  std::__cxx11::string::~string((string *)&this->m_signature_rest);
  std::__cxx11::string::~string((string *)&this->m_invoke_offset);
  kaitai::kstruct::~kstruct(&this->super_kstruct);
  return;
}

Assistant:

ami_nvar_t::nvar_entry_t::~nvar_entry_t() {
    _clean_up();
}